

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall CCharacter::FireWeapon(CCharacter *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  vec2 vVar2;
  uint uVar4;
  long lVar5;
  CGameWorld *pCVar6;
  IServer *pIVar7;
  IConsole *pIVar8;
  CCharacter *this_00;
  CGameWorld *pCVar9;
  vec2 Pos;
  vec2 Pos0;
  vec2 Pos_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vec2 Pos_01;
  vec2 Pos_02;
  undefined4 uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  undefined4 extraout_var;
  CLaser *this_01;
  CProjectile *pCVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  CGameContext *pCVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  long in_FS_OFFSET;
  float fVar27;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar28;
  float fVar29;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar30;
  vec2 vVar32;
  float fVar31;
  vec2 Dir;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar35;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar36;
  undefined1 auVar37 [16];
  vec2 Force;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float local_268;
  char aBuf [256];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_ReloadTimer != 0) goto LAB_00117a03;
  if ((this->m_QueuedWeapon != -1) && (this->m_aWeapons[5].m_Got == false)) {
    SetWeapon(this,this->m_QueuedWeapon);
  }
  uVar1 = (this->m_LatestInput).m_TargetX;
  uVar3 = (this->m_LatestInput).m_TargetY;
  auVar33._0_4_ = (float)(int)uVar1;
  auVar33._4_4_ = (float)(int)uVar3;
  auVar33._8_8_ = 0;
  fVar27 = auVar33._0_4_ * auVar33._0_4_ + auVar33._4_4_ * auVar33._4_4_;
  if (fVar27 < 0.0) {
    fVar27 = sqrtf(fVar27);
  }
  else {
    fVar27 = SQRT(fVar27);
  }
  uVar15 = this->m_ActiveWeapon;
  uVar20 = (this->m_LatestPrevInput).m_Fire;
  uVar4 = (this->m_LatestInput).m_Fire;
  uVar22 = uVar4 & 0x3f;
  uVar23 = uVar20 & 0x3f;
  uVar19 = 0;
  if (uVar23 != uVar22) {
    do {
      uVar24 = uVar23 + 1;
      uVar19 = uVar19 + (~uVar20 & 1);
      uVar23 = uVar24 & 0x3f;
      uVar20 = uVar24;
    } while (uVar23 != uVar22);
    uVar19 = (uint)(uVar19 != 0);
  }
  cVar18 = (char)uVar19;
  if (((uVar4 & 1) != 0 && 0xfffffffc < uVar15 - 5) &&
     (cVar18 = '\x01', this->m_aWeapons[uVar15].m_Ammo == 0)) {
    cVar18 = (char)uVar19;
  }
  if (cVar18 == '\0') goto LAB_00117a03;
  if (this->m_aWeapons[(int)uVar15].m_Ammo == 0) {
    pCVar6 = (this->super_CEntity).m_pGameWorld;
    pIVar7 = pCVar6->m_pServer;
    iVar14 = pIVar7->m_TickSpeed;
    iVar16 = iVar14 + 7;
    if (-1 < iVar14) {
      iVar16 = iVar14;
    }
    this->m_ReloadTimer = iVar16 >> 3;
    if (iVar14 + this->m_LastNoAmmoSound <= pIVar7->m_CurrentGameTick) {
      CGameContext::CreateSound(pCVar6->m_pGameServer,(this->super_CEntity).m_Pos,0x1e,-1);
      this->m_LastNoAmmoSound = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_CurrentGameTick;
    }
    goto LAB_00117a03;
  }
  uVar13 = (this->super_CEntity).m_ProximityRadius;
  vVar32 = (this->super_CEntity).m_Pos;
  pCVar6 = (this->super_CEntity).m_pGameWorld;
  fVar29 = (this->super_CEntity).m_ProximityRadius;
  if (pCVar6->m_pConfig->m_Debug != 0) {
    uVar15 = this->m_pPlayer->m_ClientID;
    pIVar7 = pCVar6->m_pServer;
    iVar14 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar15);
    str_format(aBuf,0x100,"shot player=\'%d:%s\' team=%d weapon=%d",(ulong)uVar15,
               CONCAT44(extraout_var,iVar14),(ulong)(uint)this->m_pPlayer->m_Team,
               (ulong)(uint)this->m_ActiveWeapon);
    pIVar8 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_pConsole;
    (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",aBuf,0);
    fVar29 = (float)uVar13;
  }
  if ((uint)this->m_ActiveWeapon < 6) {
    auVar37._4_4_ = fVar27;
    auVar37._0_4_ = fVar27;
    auVar37._8_4_ = fVar27;
    auVar37._12_4_ = fVar27;
    auVar33 = divps(auVar33,auVar37);
    aVar35.x = vVar32.field_0.x + fVar29 * auVar33._0_4_ * 0.75;
    aVar36.y = vVar32.field_1.y + fVar29 * auVar33._4_4_ * 0.75;
    vVar32 = auVar33._0_8_;
    switch(this->m_ActiveWeapon) {
    case 0:
      CGameContext::CreateSound
                (((this->super_CEntity).m_pGameWorld)->m_pGameServer,(this->super_CEntity).m_Pos,3,
                 -1);
      Pos_01.field_1.y = aVar36.y;
      Pos_01.field_0.x = aVar35.x;
      uVar15 = CGameWorld::FindEntities
                         ((this->super_CEntity).m_pGameWorld,Pos_01,
                          (this->super_CEntity).m_ProximityRadius * 0.5,(CEntity **)aBuf,0x40,3);
      if (0 < (int)uVar15) {
        uVar25 = 0;
        iVar14 = 0;
        do {
          this_00 = *(CCharacter **)(aBuf + uVar25 * 8);
          if ((this_00 != this) &&
             (Pos0.field_1.y = aVar36.y, Pos0.field_0.x = aVar35.x,
             iVar16 = CCollision::IntersectLine
                                (&((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Collision,
                                 Pos0,(this_00->super_CEntity).m_Pos,(vec2 *)0x0,(vec2 *)0x0),
             iVar16 == 0)) {
            fVar27 = (this_00->super_CEntity).m_Pos.field_0.x - aVar35.x;
            fVar31 = (this_00->super_CEntity).m_Pos.field_1.y - aVar36.y;
            fVar27 = fVar27 * fVar27 + fVar31 * fVar31;
            if (fVar27 < 0.0) {
              fVar27 = sqrtf(fVar27);
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
            aVar28.x = aVar35.x;
            aVar30.y = aVar36.y;
            if (0.0 < fVar27) {
              vVar32 = (this_00->super_CEntity).m_Pos;
              auVar39._0_4_ = vVar32.field_0.x - aVar35.x;
              auVar39._4_4_ = vVar32.field_1.y - aVar36.y;
              auVar39._8_4_ = 0.0 - (fVar29 * auVar33._8_4_ * 0.0 + 0.0);
              auVar39._12_4_ = 0.0 - (fVar29 * auVar33._12_4_ * 0.0 + 0.0);
              fVar27 = auVar39._0_4_ * auVar39._0_4_ + auVar39._4_4_ * auVar39._4_4_;
              if (fVar27 < 0.0) {
                fVar27 = sqrtf(fVar27);
              }
              else {
                fVar27 = SQRT(fVar27);
              }
              auVar10._4_4_ = fVar27;
              auVar10._0_4_ = fVar27;
              auVar10._8_4_ = fVar27;
              auVar10._12_4_ = fVar27;
              auVar37 = divps(auVar39,auVar10);
              fVar27 = (this->super_CEntity).m_ProximityRadius;
              vVar32 = (this_00->super_CEntity).m_Pos;
              aVar28.x = vVar32.field_0.x + fVar27 * auVar37._0_4_ * -0.5;
              aVar30.y = vVar32.field_1.y + fVar27 * auVar37._4_4_ * -0.5;
            }
            Pos_00.field_1.y = aVar30.y;
            Pos_00.field_0.x = aVar28.x;
            CGameContext::CreateHammerHit(pCVar21,Pos_00);
            fVar27 = (this_00->super_CEntity).m_Pos.field_0.x -
                     (this->super_CEntity).m_Pos.field_0.x;
            fVar31 = (this_00->super_CEntity).m_Pos.field_1.y -
                     (this->super_CEntity).m_Pos.field_1.y;
            fVar27 = fVar27 * fVar27 + fVar31 * fVar31;
            if (fVar27 < 0.0) {
              fVar27 = sqrtf(fVar27);
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            auVar37 = ZEXT816(0xbf80000000000000);
            if (0.0 < fVar27) {
              vVar32 = (this_00->super_CEntity).m_Pos;
              vVar2 = (this->super_CEntity).m_Pos;
              auVar34._0_4_ = vVar32.field_0.x - vVar2.field_0.x;
              auVar34._4_4_ = vVar32.field_1.y - vVar2.field_1.y;
              auVar34._8_8_ = 0;
              fVar27 = auVar34._0_4_ * auVar34._0_4_ + auVar34._4_4_ * auVar34._4_4_;
              if (fVar27 < 0.0) {
                fVar27 = sqrtf(fVar27);
              }
              else {
                fVar27 = SQRT(fVar27);
              }
              auVar11._4_4_ = fVar27;
              auVar11._0_4_ = fVar27;
              auVar11._8_4_ = fVar27;
              auVar11._12_4_ = fVar27;
              auVar37 = divps(auVar34,auVar11);
            }
            auVar38._0_4_ = auVar37._0_4_ + 0.0;
            auVar38._4_4_ = auVar37._4_4_ + -1.1;
            auVar38._8_4_ = auVar37._8_4_ + 0.0;
            auVar38._12_4_ = auVar37._12_4_ + 0.0;
            fVar27 = auVar38._0_4_ * auVar38._0_4_ + auVar38._4_4_ * auVar38._4_4_;
            if (fVar27 < 0.0) {
              fVar27 = sqrtf(fVar27);
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            auVar12._4_4_ = fVar27;
            auVar12._0_4_ = fVar27;
            auVar12._8_4_ = fVar27;
            auVar12._12_4_ = fVar27;
            auVar39 = divps(auVar38,auVar12);
            Force.field_0.x = auVar39._0_4_ * 10.0 + 0.0;
            Force.field_1.y = auVar39._4_4_ * 10.0 + -1.0;
            TakeDamage(this_00,Force,(vec2)(auVar37._0_8_ ^ 0x8000000080000000),
                       ((g_pData->m_Weapons).m_Hammer.m_pBase)->m_Damage,this->m_pPlayer->m_ClientID
                       ,this->m_ActiveWeapon);
            iVar14 = iVar14 + 1;
          }
          uVar25 = uVar25 + 1;
        } while (uVar15 != uVar25);
        if (iVar14 != 0) {
          this->m_ReloadTimer = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_TickSpeed / 3;
        }
      }
      goto LAB_0011798a;
    case 1:
      pCVar17 = (CProjectile *)mem_alloc(0x68);
      mem_zero(pCVar17,0x68);
      pCVar6 = (this->super_CEntity).m_pGameWorld;
      Pos_02.field_1.y = aVar36.y;
      Pos_02.field_0.x = aVar35.x;
      CProjectile::CProjectile
                (pCVar17,pCVar6,1,this->m_pPlayer->m_ClientID,Pos_02,vVar32,
                 (int)(((float)(pCVar6->m_pGameServer->m_Tuning).m_GunLifetime.m_Value / 100.0) *
                      (float)pCVar6->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Gun.m_pBase)->m_Damage,false,0.0,-1,1);
      pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      aVar35 = vVar32.field_0;
      aVar36 = vVar32.field_1;
      iVar14 = 0;
      break;
    case 2:
      iVar14 = -2;
      lVar26 = 0;
      do {
        fVar27 = atan2f(auVar33._4_4_,auVar33._0_4_);
        fVar27 = fVar27 + *(float *)((long)&DAT_00148d60 + lVar26);
        iVar16 = -iVar14;
        if (0 < iVar14) {
          iVar16 = iVar14;
        }
        fVar31 = (float)(((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Tuning).
                        m_ShotgunSpeeddiff.m_Value / 100.0;
        fVar31 = (1.0 - fVar31) * ((float)iVar16 * -0.5 + 1.0) + fVar31;
        pCVar17 = (CProjectile *)mem_alloc(0x68);
        mem_zero(pCVar17,0x68);
        pCVar6 = (this->super_CEntity).m_pGameWorld;
        iVar16 = this->m_pPlayer->m_ClientID;
        fVar29 = cosf(fVar27);
        fVar27 = sinf(fVar27);
        pCVar9 = (this->super_CEntity).m_pGameWorld;
        Dir.field_1.y = fVar27 * fVar31;
        Dir.field_0.x = fVar29 * fVar31;
        vVar32.field_1.y = aVar36.y;
        vVar32.field_0.x = aVar35.x;
        CProjectile::CProjectile
                  (pCVar17,pCVar6,2,iVar16,vVar32,Dir,
                   (int)(((float)(pCVar9->m_pGameServer->m_Tuning).m_ShotgunLifetime.m_Value / 100.0
                         ) * (float)pCVar9->m_pServer->m_TickSpeed),
                   ((g_pData->m_Weapons).m_Shotgun.m_pBase)->m_Damage,false,0.0,-1,2);
        lVar26 = lVar26 + 4;
        iVar14 = iVar14 + 1;
      } while (lVar26 != 0x14);
      pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      aVar35 = vVar32.field_0;
      aVar36 = vVar32.field_1;
      iVar14 = 1;
      break;
    case 3:
      pCVar17 = (CProjectile *)mem_alloc(0x68);
      mem_zero(pCVar17,0x68);
      pCVar6 = (this->super_CEntity).m_pGameWorld;
      vVar2.field_1.y = aVar36.y;
      vVar2.field_0.x = aVar35.x;
      CProjectile::CProjectile
                (pCVar17,pCVar6,3,this->m_pPlayer->m_ClientID,vVar2,vVar32,
                 (int)(((float)(pCVar6->m_pGameServer->m_Tuning).m_GrenadeLifetime.m_Value / 100.0)
                      * (float)pCVar6->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Grenade.m_pBase)->m_Damage,true,0.0,6,3);
      pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      aVar35 = vVar32.field_0;
      aVar36 = vVar32.field_1;
      iVar14 = 2;
      break;
    case 4:
      this_01 = (CLaser *)mem_alloc(0x58);
      mem_zero(this_01,0x58);
      pCVar6 = (this->super_CEntity).m_pGameWorld;
      CLaser::CLaser(this_01,pCVar6,(this->super_CEntity).m_Pos,vVar32,
                     (float)(pCVar6->m_pGameServer->m_Tuning).m_LaserReach.m_Value / 100.0,
                     this->m_pPlayer->m_ClientID);
      pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      aVar35 = vVar32.field_0;
      aVar36 = vVar32.field_1;
      iVar14 = 8;
      break;
    case 5:
      this->m_NumObjectsHit = 0;
      (this->m_Ninja).m_ActivationDir = vVar32;
      (this->m_Ninja).m_CurrentMoveTime =
           (((this->super_CEntity).m_pGameWorld)->m_pServer->m_TickSpeed *
           (g_pData->m_Weapons).m_Ninja.m_Movetime) / 1000;
      fVar27 = (this->m_Core).m_Vel.field_0.x;
      fVar29 = (this->m_Core).m_Vel.field_1.y;
      fVar27 = fVar27 * fVar27 + fVar29 * fVar29;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      (this->m_Ninja).m_OldVelAmount = (int)fVar27;
      pCVar21 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar32 = (this->super_CEntity).m_Pos;
      aVar35 = vVar32.field_0;
      aVar36 = vVar32.field_1;
      iVar14 = 5;
    }
    Pos.field_1 = aVar36;
    Pos.field_0 = aVar35;
    CGameContext::CreateSound(pCVar21,Pos,iVar14,-1);
  }
LAB_0011798a:
  pIVar7 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
  this->m_AttackTick = pIVar7->m_CurrentGameTick;
  iVar14 = this->m_ActiveWeapon;
  iVar16 = this->m_aWeapons[iVar14].m_Ammo;
  if (0 < iVar16) {
    this->m_aWeapons[iVar14].m_Ammo = iVar16 + -1;
  }
  if (this->m_ReloadTimer == 0) {
    this->m_ReloadTimer =
         (pIVar7->m_TickSpeed * (g_pData->m_Weapons).m_aId[iVar14].m_Firedelay) / 1000;
  }
LAB_00117a03:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacter::FireWeapon()
{
	if(m_ReloadTimer != 0)
		return;

	DoWeaponSwitch();
	vec2 Direction = normalize(vec2(m_LatestInput.m_TargetX, m_LatestInput.m_TargetY));

	bool FullAuto = false;
	if(m_ActiveWeapon == WEAPON_GRENADE || m_ActiveWeapon == WEAPON_SHOTGUN || m_ActiveWeapon == WEAPON_LASER)
		FullAuto = true;


	// check if we gonna fire
	bool WillFire = false;
	if(CountInput(m_LatestPrevInput.m_Fire, m_LatestInput.m_Fire).m_Presses)
		WillFire = true;

	if(FullAuto && (m_LatestInput.m_Fire&1) && m_aWeapons[m_ActiveWeapon].m_Ammo)
		WillFire = true;

	if(!WillFire)
		return;

	// check for ammo
	if(!m_aWeapons[m_ActiveWeapon].m_Ammo)
	{
		// 125ms is a magical limit of how fast a human can click
		m_ReloadTimer = 125 * Server()->TickSpeed() / 1000;
		if(m_LastNoAmmoSound+Server()->TickSpeed() <= Server()->Tick())
		{
			GameServer()->CreateSound(m_Pos, SOUND_WEAPON_NOAMMO);
			m_LastNoAmmoSound = Server()->Tick();
		}
		return;
	}

	vec2 ProjStartPos = m_Pos+Direction*GetProximityRadius()*0.75f;

	if(Config()->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "shot player='%d:%s' team=%d weapon=%d", m_pPlayer->GetCID(), Server()->ClientName(m_pPlayer->GetCID()), m_pPlayer->GetTeam(), m_ActiveWeapon);
		GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
	}

	switch(m_ActiveWeapon)
	{
		case WEAPON_HAMMER:
		{
			GameServer()->CreateSound(m_Pos, SOUND_HAMMER_FIRE);

			CCharacter *apEnts[MAX_CLIENTS];
			int Hits = 0;
			int Num = GameWorld()->FindEntities(ProjStartPos, GetProximityRadius()*0.5f, (CEntity**)apEnts,
														MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);

			for(int i = 0; i < Num; ++i)
			{
				CCharacter *pTarget = apEnts[i];

				if((pTarget == this) || GameServer()->Collision()->IntersectLine(ProjStartPos, pTarget->m_Pos, NULL, NULL))
					continue;

				// set his velocity to fast upward (for now)
				if(length(pTarget->m_Pos-ProjStartPos) > 0.0f)
					GameServer()->CreateHammerHit(pTarget->m_Pos-normalize(pTarget->m_Pos-ProjStartPos)*GetProximityRadius()*0.5f);
				else
					GameServer()->CreateHammerHit(ProjStartPos);

				vec2 Dir;
				if(length(pTarget->m_Pos - m_Pos) > 0.0f)
					Dir = normalize(pTarget->m_Pos - m_Pos);
				else
					Dir = vec2(0.f, -1.f);

				pTarget->TakeDamage(vec2(0.f, -1.f) + normalize(Dir + vec2(0.f, -1.1f)) * 10.0f, Dir*-1, g_pData->m_Weapons.m_Hammer.m_pBase->m_Damage,
					m_pPlayer->GetCID(), m_ActiveWeapon);
				Hits++;
			}

			// if we Hit anything, we have to wait for the reload
			if(Hits)
				m_ReloadTimer = Server()->TickSpeed()/3;

		} break;

		case WEAPON_GUN:
		{
			new CProjectile(GameWorld(), WEAPON_GUN,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GunLifetime),
				g_pData->m_Weapons.m_Gun.m_pBase->m_Damage, false, 0, -1, WEAPON_GUN);

			GameServer()->CreateSound(m_Pos, SOUND_GUN_FIRE);
		} break;

		case WEAPON_SHOTGUN:
		{
			int ShotSpread = 2;

			for(int i = -ShotSpread; i <= ShotSpread; ++i)
			{
				float Spreading[] = {-0.185f, -0.070f, 0, 0.070f, 0.185f};
				float a = angle(Direction);
				a += Spreading[i+2];
				float v = 1-(absolute(i)/(float)ShotSpread);
				float Speed = mix((float)GameServer()->Tuning()->m_ShotgunSpeeddiff, 1.0f, v);
				new CProjectile(GameWorld(), WEAPON_SHOTGUN,
					m_pPlayer->GetCID(),
					ProjStartPos,
					vec2(cosf(a), sinf(a))*Speed,
					(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_ShotgunLifetime),
					g_pData->m_Weapons.m_Shotgun.m_pBase->m_Damage, false, 0, -1, WEAPON_SHOTGUN);
			}

			GameServer()->CreateSound(m_Pos, SOUND_SHOTGUN_FIRE);
		} break;

		case WEAPON_GRENADE:
		{
			new CProjectile(GameWorld(), WEAPON_GRENADE,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GrenadeLifetime),
				g_pData->m_Weapons.m_Grenade.m_pBase->m_Damage, true, 0, SOUND_GRENADE_EXPLODE, WEAPON_GRENADE);

			GameServer()->CreateSound(m_Pos, SOUND_GRENADE_FIRE);
		} break;

		case WEAPON_LASER:
		{
			new CLaser(GameWorld(), m_Pos, Direction, GameServer()->Tuning()->m_LaserReach, m_pPlayer->GetCID());
			GameServer()->CreateSound(m_Pos, SOUND_LASER_FIRE);
		} break;

		case WEAPON_NINJA:
		{
			m_NumObjectsHit = 0;

			m_Ninja.m_ActivationDir = Direction;
			m_Ninja.m_CurrentMoveTime = g_pData->m_Weapons.m_Ninja.m_Movetime * Server()->TickSpeed() / 1000;
			m_Ninja.m_OldVelAmount = length(m_Core.m_Vel);

			GameServer()->CreateSound(m_Pos, SOUND_NINJA_FIRE);
		} break;

	}

	m_AttackTick = Server()->Tick();

	if(m_aWeapons[m_ActiveWeapon].m_Ammo > 0) // -1 == unlimited
		m_aWeapons[m_ActiveWeapon].m_Ammo--;

	if(!m_ReloadTimer)
		m_ReloadTimer = g_pData->m_Weapons.m_aId[m_ActiveWeapon].m_Firedelay * Server()->TickSpeed() / 1000;
}